

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::unicodeIntOrRange(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *pAVar1;
  bool bVar2;
  int iVar3;
  NoViableAltException *this_01;
  RefAST tmp149_AST;
  RefAST tmp148_AST;
  RefAST tmp150_AST;
  RefAST unicodeIntOrRange_AST;
  ASTPair currentAST;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  ASTFactory local_70;
  RefCount<Token> local_60;
  RefToken local_58;
  RefAST local_50;
  RefAST local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  unicodeIntOrRange_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 0x1b) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    tmp148_AST = nullAST;
    if (iVar3 == 0x20) {
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_60,this,1);
      pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
      ASTFactory::create((ASTFactory *)&tmp149_AST,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&tmp148_AST,&tmp149_AST);
      RefCount<AST>::~RefCount(&tmp149_AST);
      RefCount<Token>::~RefCount(&local_60);
      if (tmp148_AST.ref != (Ref *)0x0) {
        (tmp148_AST.ref)->count = (tmp148_AST.ref)->count + 1;
      }
      local_38.ref = tmp148_AST.ref;
      ASTFactory::addASTChild(pAVar1,&currentAST,&local_38);
      RefCount<AST>::~RefCount(&local_38);
      Parser::match((Parser *)this,0x1b);
      tmp149_AST = nullAST;
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70.nodeFactory,this,1);
      ASTFactory::create((ASTFactory *)&tmp150_AST,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&tmp149_AST,&tmp150_AST);
      RefCount<AST>::~RefCount(&tmp150_AST);
      RefCount<Token>::~RefCount((RefCount<Token> *)&local_70.nodeFactory);
      if (tmp149_AST.ref != (Ref *)0x0) {
        (tmp149_AST.ref)->count = (tmp149_AST.ref)->count + 1;
      }
      local_40.ref = tmp149_AST.ref;
      ASTFactory::makeASTRoot(pAVar1,&currentAST,&local_40);
      RefCount<AST>::~RefCount(&local_40);
      Parser::match((Parser *)this,0x20);
      tmp150_AST = nullAST;
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
      ASTFactory::create(&local_70,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&tmp150_AST,(RefCount<AST> *)&local_70);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_70);
      RefCount<Token>::~RefCount(&local_78);
      if (tmp150_AST.ref != (Ref *)0x0) {
        (tmp150_AST.ref)->count = (tmp150_AST.ref)->count + 1;
      }
      local_48.ref = tmp150_AST.ref;
      ASTFactory::addASTChild(pAVar1,&currentAST,&local_48);
      RefCount<AST>::~RefCount(&local_48);
      Parser::match((Parser *)this,0x1b);
      RefCount<AST>::~RefCount(&tmp150_AST);
      RefCount<AST>::~RefCount(&tmp149_AST);
      goto LAB_001773d4;
    }
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 0x1b) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_35,iVar3);
    tmp148_AST = nullAST;
    if (bVar2) {
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
      pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
      ASTFactory::create((ASTFactory *)&tmp149_AST,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&tmp148_AST,&tmp149_AST);
      RefCount<AST>::~RefCount(&tmp149_AST);
      RefCount<Token>::~RefCount(&local_80);
      if (tmp148_AST.ref != (Ref *)0x0) {
        (tmp148_AST.ref)->count = (tmp148_AST.ref)->count + 1;
      }
      local_50.ref = tmp148_AST.ref;
      ASTFactory::addASTChild(pAVar1,&currentAST,&local_50);
      RefCount<AST>::~RefCount(&local_50);
      Parser::match((Parser *)this,0x1b);
LAB_001773d4:
      RefCount<AST>::~RefCount(&tmp148_AST);
      RefCount<AST>::operator=(&unicodeIntOrRange_AST,&currentAST.root);
      RefCount<AST>::operator=(this_00,&unicodeIntOrRange_AST);
      RefCount<AST>::~RefCount(&unicodeIntOrRange_AST);
      ASTPair::~ASTPair(&currentAST);
      return;
    }
  }
  this_01 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_58,this,1);
  NoViableAltException::NoViableAltException(this_01,&local_58);
  __cxa_throw(this_01,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::unicodeIntOrRange() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST unicodeIntOrRange_AST = nullAST;
	
	try {      // for error handling
		{
		if ((LA(1)==LIT_UHEX) && (LA(2)==OP_DOTDOT)) {
			RefAST tmp148_AST = nullAST;
			tmp148_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp148_AST);
			match(LIT_UHEX);
			RefAST tmp149_AST = nullAST;
			tmp149_AST = astFactory.create(LT(1));
			astFactory.makeASTRoot(currentAST, tmp149_AST);
			match(OP_DOTDOT);
			RefAST tmp150_AST = nullAST;
			tmp150_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp150_AST);
			match(LIT_UHEX);
		}
		else if ((LA(1)==LIT_UHEX) && (_tokenSet_35.member(LA(2)))) {
			RefAST tmp151_AST = nullAST;
			tmp151_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp151_AST);
			match(LIT_UHEX);
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		unicodeIntOrRange_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_35);
	}
	returnAST = unicodeIntOrRange_AST;
}